

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

void __thiscall
LinkedReadsDatastore::dump_tag_occupancy_histogram(LinkedReadsDatastore *this,string *filename)

{
  uint uVar1;
  ostream *poVar2;
  pair<unsigned_int,_unsigned_int> *t;
  pointer ppVar3;
  int i;
  long lVar4;
  ofstream tohf;
  uint64_t oh [10001];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  vStack_13ad0;
  long lStack_13ab8;
  filebuf afStack_13ab0 [240];
  ios_base aiStack_139c0 [264];
  long alStack_138b8 [10002];
  
  std::ofstream::ofstream(&lStack_13ab8,(string *)filename,_S_out);
  memset(alStack_138b8,0,0x13888);
  get_tag_readcount(&vStack_13ad0,this);
  for (ppVar3 = vStack_13ad0.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != vStack_13ad0.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    uVar1 = ppVar3->second;
    if (9999 < ppVar3->second) {
      uVar1 = 10000;
    }
    alStack_138b8[uVar1] = alStack_138b8[uVar1] + 1;
  }
  if (vStack_13ad0.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_13ad0.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_13ad0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_13ad0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar4 = 0;
  do {
    if (alStack_138b8[lVar4] != 0) {
      poVar2 = (ostream *)std::ostream::operator<<(&lStack_13ab8,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x2711);
  lStack_13ab8 = _VTT;
  *(undefined8 *)(afStack_13ab0 + *(long *)(_VTT + -0x18) + -8) = _setbuf;
  std::filebuf::~filebuf(afStack_13ab0);
  std::ios_base::~ios_base(aiStack_139c0);
  return;
}

Assistant:

void LinkedReadsDatastore::dump_tag_occupancy_histogram(std::string filename) {
    std::ofstream tohf(filename);
    uint64_t oh[10001];
    for (auto &o:oh) o=0;
    for (auto &t:get_tag_readcount()){
        ++oh[(t.second>10000 ? 10000:t.second)];
    }
    for (auto i=0;i<10001;++i)
        if (oh[i]) tohf<<i<<","<<oh[i]<<std::endl;
}